

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O2

int nn_xsub_recv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  uint8_t *data;
  size_t size;
  char *pcVar2;
  uint errnum;
  FILE *__stream;
  undefined8 uVar3;
  
  while( true ) {
    iVar1 = nn_fq_recv((nn_fq *)(self + 1),msg,(nn_pipe **)0x0);
    __stream = _stderr;
    if (iVar1 == -0xb) {
      return -0xb;
    }
    if (iVar1 < 0) break;
    data = (uint8_t *)nn_chunkref_data(&msg->body);
    size = nn_chunkref_size(&msg->body);
    iVar1 = nn_trie_match((nn_trie *)&self[0x19].sock,data,size);
    __stream = _stderr;
    if (iVar1 != 0) {
      if (iVar1 == 1) {
        return 0;
      }
      errnum = -iVar1;
      pcVar2 = nn_err_strerror(errnum);
      uVar3 = 0xb8;
      goto LAB_0011b674;
    }
    nn_msg_term(msg);
  }
  errnum = -iVar1;
  pcVar2 = nn_err_strerror(errnum);
  uVar3 = 0xaf;
LAB_0011b674:
  fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)errnum,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/xsub.c"
          ,uVar3);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_xsub_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xsub *xsub;

    xsub = nn_cont (self, struct nn_xsub, sockbase);

    /*  Loop while a matching message is found or when there are no more
        messages to receive. */
    while (1) {
        rc = nn_fq_recv (&xsub->fq, msg, NULL);
        if (nn_slow (rc == -EAGAIN))
            return -EAGAIN;
        errnum_assert (rc >= 0, -rc);
        rc = nn_trie_match (&xsub->trie, nn_chunkref_data (&msg->body),
            nn_chunkref_size (&msg->body));
        if (rc == 0) {
            nn_msg_term (msg);
            continue;
        }
        if (rc == 1)
            return 0;
        errnum_assert (0, -rc);
    }
}